

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase434::run(TestCase434 *this)

{
  int iVar1;
  int osErrorNumber;
  ssize_t sVar2;
  TransformPromiseNodeBase *this_00;
  char *pcVar3;
  nfds_t __nfds;
  nfds_t __nfds_00;
  pollfd *ppVar4;
  bool writable;
  AutoCloseFd outfd;
  AutoCloseFd infd;
  int pipefds [2];
  Own<kj::_::PromiseNode> local_11d8;
  undefined1 local_11c8 [16];
  WaitScope waitScope;
  Fault f_2;
  Promise<void> promise;
  EventLoop loop;
  FdObserver observer;
  UnixEventPort port;
  char buffer [4096];
  
  captureSignals();
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  do {
    iVar1 = ::pipe(pipefds);
    if (-1 < iVar1) goto LAB_0020ed6b;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)buffer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1b9,iVar1,"pipe(pipefds)","");
    _::Debug::Fault::fatal((Fault *)buffer);
  }
LAB_0020ed6b:
  infd.fd = pipefds[0];
  UnwindDetector::UnwindDetector(&infd.unwindDetector);
  outfd.fd = pipefds[1];
  UnwindDetector::UnwindDetector(&outfd.unwindDetector);
  setNonblocking(outfd.fd);
  setNonblocking(infd.fd);
  pcVar3 = (char *)0x2;
  UnixEventPort::FdObserver::FdObserver(&observer,&port,outfd.fd,2);
  do {
    do {
      sVar2 = ::write(outfd.fd,"foo",3);
    } while (-1 < sVar2);
    iVar1 = _::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)buffer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1c3,iVar1,"n = write(outfd, \"foo\", 3)","");
    _::Debug::Fault::fatal((Fault *)buffer);
  }
  writable = false;
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_11c8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_11c8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:456:13),_kj::_::PropagateException>
             ::anon_class_8_1_79db791e_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041e088;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&writable;
  buffer._0_8_ = &_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase434::run()::$_2,kj::_::PropagateException>>
                  ::instance;
  f_2.exception =
       (Exception *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase434::run()::$_2,kj::_::PropagateException>>
        ::instance;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_11d8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase434::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_11d8.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)buffer);
  Promise<void>::eagerlyEvaluate(&promise,&local_11d8);
  Own<kj::_::PromiseNode>::dispose(&local_11d8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_11c8);
  ppVar4 = (pollfd *)0xffffffffffffffff;
  EventLoop::run(&loop,0xffffffff);
  UnixEventPort::poll(&port,ppVar4,__nfds,(int)pcVar3);
  EventLoop::run(&loop,0xffffffff);
  if ((writable == true) && (_::Debug::minSeverity < 3)) {
    pcVar3 = "\"failed: expected \" \"!(writable)\"";
    _::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1ce,ERROR,"\"failed: expected \" \"!(writable)\"",
               (char (*) [29])"failed: expected !(writable)");
  }
  do {
    while( true ) {
      sVar2 = read(infd.fd,buffer,0x1000);
      iVar1 = (int)pcVar3;
      if (sVar2 < 0) break;
      if (sVar2 == 0) {
LAB_0020ef36:
        ppVar4 = (pollfd *)0xffffffffffffffff;
        EventLoop::run(&loop,0xffffffff);
        UnixEventPort::poll(&port,ppVar4,__nfds_00,iVar1);
        EventLoop::run(&loop,0xffffffff);
        if ((writable == false) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[26]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                     ,0x1dd,ERROR,"\"failed: expected \" \"writable\"",
                     (char (*) [26])"failed: expected writable");
        }
        Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
        UnixEventPort::FdObserver::~FdObserver(&observer);
        AutoCloseFd::~AutoCloseFd(&outfd);
        AutoCloseFd::~AutoCloseFd(&infd);
        WaitScope::~WaitScope(&waitScope);
        EventLoop::~EventLoop(&loop);
        UnixEventPort::~UnixEventPort(&port);
        return;
      }
    }
    osErrorNumber = _::Debug::getOsErrorNumber(true);
    iVar1 = (int)pcVar3;
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&f_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1d6,osErrorNumber,"n = read(infd, &buffer, sizeof(buffer))","");
    _::Debug::Fault::fatal(&f_2);
  }
  goto LAB_0020ef36;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  kj::AutoCloseFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096];
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}